

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

bool __thiscall pbrt::Vertex::IsConnectible(Vertex *this)

{
  bool bVar1;
  
  switch(this->type) {
  case Camera:
  case Medium:
    return true;
  case Light:
    return *(int *)((ulong)(this->field_2).ei.field_0 & 0xffffffffffff) != 1;
  case Surface:
    bVar1 = BSDF::IsNonSpecular(&this->bsdf);
    return bVar1;
  default:
    LogFatal(Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/integrators.cpp"
             ,0x672,"Unhandled vertex type in IsConnectable()");
  }
}

Assistant:

bool IsConnectible() const {
        switch (type) {
        case VertexType::Medium:
            return true;
        case VertexType::Light:
            return ei.light.Type() != LightType::DeltaDirection;
        case VertexType::Camera:
            return true;
        case VertexType::Surface:
            return bsdf.IsNonSpecular();
        }
        LOG_FATAL("Unhandled vertex type in IsConnectable()");
    }